

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chained_buffer.cpp
# Opt level: O2

void __thiscall
libtorrent::chained_buffer::build_vec<boost::asio::const_buffer>
          (chained_buffer *this,int bytes,
          vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_> *vec)

{
  buffer_t *pbVar1;
  int iVar2;
  _Elt_pointer pbVar3;
  _Elt_pointer pbVar4;
  char **__args;
  _Map_pointer local_40;
  unsigned_long local_38;
  
  local_38 = (unsigned_long)(uint)bytes;
  pbVar4 = (this->m_vec).
           super__Deque_base<libtorrent::chained_buffer::buffer_t,_std::allocator<libtorrent::chained_buffer::buffer_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar3 = (this->m_vec).
           super__Deque_base<libtorrent::chained_buffer::buffer_t,_std::allocator<libtorrent::chained_buffer::buffer_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_40 = (this->m_vec).
             super__Deque_base<libtorrent::chained_buffer::buffer_t,_std::allocator<libtorrent::chained_buffer::buffer_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar1 = (this->m_vec).
           super__Deque_base<libtorrent::chained_buffer::buffer_t,_std::allocator<libtorrent::chained_buffer::buffer_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  do {
    __args = &pbVar4->buf;
    do {
      iVar2 = (int)local_38;
      if ((iVar2 < 1) || ((buffer_t *)(__args + -5) == pbVar1)) {
        return;
      }
      if (iVar2 < *(int *)((long)__args + 0xc)) {
        std::vector<boost::asio::const_buffer,std::allocator<boost::asio::const_buffer>>::
        emplace_back<char*&,unsigned_long>
                  ((vector<boost::asio::const_buffer,std::allocator<boost::asio::const_buffer>> *)
                   vec,__args,&local_38);
        return;
      }
      local_38 = (long)*(int *)((long)__args + 0xc);
      std::vector<boost::asio::const_buffer,std::allocator<boost::asio::const_buffer>>::
      emplace_back<char*&,unsigned_long>
                ((vector<boost::asio::const_buffer,std::allocator<boost::asio::const_buffer>> *)vec,
                 __args,&local_38);
      local_38 = (unsigned_long)(uint)(iVar2 - *(int *)((long)__args + 0xc));
      pbVar4 = (_Elt_pointer)(__args + 2);
      __args = __args + 7;
    } while (pbVar4 != pbVar3);
    pbVar4 = local_40[1];
    local_40 = local_40 + 1;
    pbVar3 = pbVar4 + 9;
  } while( true );
}

Assistant:

void chained_buffer::build_vec(int bytes, std::vector<Buffer>& vec)
	{
		TORRENT_ASSERT(!m_destructed);
		for (auto i = m_vec.begin(), end(m_vec.end()); bytes > 0 && i != end; ++i)
		{
			TORRENT_ASSERT(i->buf != nullptr);
			if (i->used_size > bytes)
			{
				TORRENT_ASSERT(bytes > 0);
				vec.emplace_back(i->buf, std::size_t(bytes));
				break;
			}
			TORRENT_ASSERT(i->used_size > 0);
			vec.emplace_back(i->buf, std::size_t(i->used_size));
			bytes -= i->used_size;
		}
	}